

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O3

HaarWavelet * __thiscall imagestego::impl::HaarWavelet::inverse(HaarWavelet *this,Mat *mat)

{
  pointer pMVar1;
  HaarWavelet *pHVar2;
  void *pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  pointer pMVar4;
  pointer pMVar5;
  void *pvVar6;
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  undefined1 local_109;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_108;
  HaarWavelet *local_f0;
  _OutputArray local_e8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_c8;
  pointer local_a8;
  HaarWavelet *local_a0;
  Size local_98;
  _InputArray local_90 [4];
  
  local_f0 = this;
  cv::Mat::Mat((Mat *)this);
  local_c8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__InputArray.obj = &local_108;
  local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90[0].sz.width = 0;
  local_90[0].sz.height = 0;
  local_90[0].flags = 0x1010000;
  local_e8.super__InputArray.sz.width = 0;
  local_e8.super__InputArray.sz.height = 0;
  local_e8.super__InputArray.flags = 0x2050000;
  local_90[0].obj = in_RDX;
  cv::split(local_90,&local_e8);
  local_e8.super__InputArray._0_8_ = (void *)0x0;
  local_e8.super__InputArray.obj = (void *)0x0;
  local_e8.super__InputArray.sz.width = 0;
  local_e8.super__InputArray.sz.height = 0;
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::reserve
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)&local_e8,
             ((long)local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  pMVar1 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar5 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar4 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a8 = pMVar4;
      std::
      async<imagestego::impl::HaarWavelet::inverse(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
                ((launch)local_90,(anon_class_1_0_00000001_for__M_head_impl *)0x3,
                 (reference_wrapper<const_cv::Mat> *)&local_109);
      std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
      emplace_back<std::future<cv::Mat>>
                ((vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>> *)&local_e8,
                 (future<cv::Mat> *)local_90);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90[0].obj !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90[0].obj);
      }
      pMVar4 = pMVar4 + 0x60;
      pMVar5 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (pMVar4 != pMVar1);
  }
  pHVar2 = local_f0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            (&local_c8,
             ((long)pMVar5 -
              (long)local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  pvVar3 = local_e8.super__InputArray.obj;
  if ((void *)local_e8.super__InputArray._0_8_ != local_e8.super__InputArray.obj) {
    pvVar6 = (void *)local_e8.super__InputArray._0_8_;
    do {
      std::future<cv::Mat>::get((future<cv::Mat> *)local_90);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                (&local_c8,(Mat *)local_90);
      cv::Mat::~Mat((Mat *)local_90);
      pvVar6 = (void *)((long)pvVar6 + 0x10);
    } while (pvVar6 != pvVar3);
  }
  local_90[0].sz.width = 0;
  local_90[0].sz.height = 0;
  local_90[0].flags = 0x1050000;
  local_98.width = 0;
  local_98.height = 0;
  local_a8 = (pointer)CONCAT44(local_a8._4_4_,0x2010000);
  local_a0 = pHVar2;
  local_90[0].obj = &local_c8;
  cv::merge(local_90,(_OutputArray *)&local_a8);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)&local_e8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_108);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_c8);
  return pHVar2;
}

Assistant:

cv::Mat inverse(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<cv::Mat> planes, _planes;
        cv::split(mat, _planes);
        std::vector<std::future<cv::Mat>> futures;
        futures.reserve(_planes.size());
        for (const cv::Mat& mat_ : _planes) {
            futures.emplace_back(std::async(
                [](const cv::Mat& src) {
                    return inverseHorizontalLifting(inverseVerticalLifting(src));
                },
                std::cref(mat_)));
        }
        planes.reserve(_planes.size());
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }